

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QCss::Pseudo>::truncate
          (QGenericArrayOps<QCss::Pseudo> *this,char *__file,__off_t __length)

{
  Pseudo *pPVar1;
  Pseudo *in_stack_ffffffffffffffd8;
  
  pPVar1 = QArrayDataPointer<QCss::Pseudo>::begin((QArrayDataPointer<QCss::Pseudo> *)0x486451);
  pPVar1 = pPVar1 + (long)__file;
  QArrayDataPointer<QCss::Pseudo>::end((QArrayDataPointer<QCss::Pseudo> *)pPVar1);
  std::destroy<QCss::Pseudo*>(pPVar1,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QCss::Pseudo>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }